

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86.cpp
# Opt level: O3

int __thiscall ncnn::Cast_x86::forward(Cast_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint _c;
  int _elempack;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  unsigned_short uVar8;
  int iVar9;
  _func_int **pp_Var10;
  void *pvVar11;
  _func_int *p_Var12;
  int iVar13;
  void *pvVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  
  p_Var12 = this->_vptr_Cast_x86[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var12) == *(int *)(&this->field_0xd4 + (long)p_Var12)) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar4 = bottom_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = top_blob->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (*top_blob->allocator->_vptr_Allocator[3])();
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar4 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar4;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar1 = bottom_blob->w;
    iVar13 = bottom_blob->h;
    iVar2 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar1;
    top_blob->h = iVar13;
    top_blob->d = iVar2;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  iVar1 = bottom_blob->w;
  iVar13 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  _c = bottom_blob->c;
  iVar9 = bottom_blob->dims;
  _elempack = bottom_blob->elempack;
  sVar16 = (size_t)_elempack;
  switch(*(int *)(&this->field_0xd4 + (long)p_Var12)) {
  case 1:
    if (*(int *)(&this->field_0xd0 + (long)p_Var12) == 3) {
      Cast::forward((Cast *)((long)&this->_vptr_Cast_x86 + (long)p_Var12),bottom_blob,top_blob,opt);
    }
    sVar16 = sVar16 * 4;
    break;
  case 2:
  case 4:
    sVar16 = (size_t)(_elempack * 2);
    break;
  case 3:
    break;
  default:
    sVar16 = bottom_blob->elemsize;
  }
  switch(iVar9) {
  case 1:
    Mat::create(top_blob,iVar1,sVar16,_elempack,opt->blob_allocator);
    break;
  case 2:
    Mat::create(top_blob,iVar1,iVar13,sVar16,_elempack,opt->blob_allocator);
    break;
  case 3:
    Mat::create(top_blob,iVar1,iVar13,_c,sVar16,_elempack,opt->blob_allocator);
    break;
  case 4:
    Mat::create(top_blob,iVar1,iVar13,iVar2,_c,sVar16,_elempack,opt->blob_allocator);
  }
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  pp_Var10 = this->_vptr_Cast_x86;
  p_Var12 = pp_Var10[-3];
  iVar9 = *(int *)(&this->field_0xd0 + (long)p_Var12);
  if (iVar9 == 1) {
    iVar9 = 1;
    if ((*(int *)(&this->field_0xd4 + (long)p_Var12) == 2) &&
       (iVar3 = bottom_blob->c, 0 < (long)iVar3)) {
      iVar9 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      lVar20 = 0;
      do {
        if (0 < iVar9) {
          sVar16 = top_blob->cstep;
          sVar5 = bottom_blob->cstep;
          sVar6 = top_blob->elemsize;
          pvVar11 = top_blob->data;
          sVar7 = bottom_blob->elemsize;
          pvVar14 = bottom_blob->data;
          lVar19 = 0;
          do {
            uVar8 = float32_to_float16(*(float *)((long)pvVar14 +
                                                 lVar19 * 4 + sVar5 * sVar7 * lVar20));
            *(unsigned_short *)((long)pvVar11 + lVar19 * 2 + sVar16 * sVar6 * lVar20) = uVar8;
            lVar19 = lVar19 + 1;
          } while (iVar9 != (int)lVar19);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar3);
      pp_Var10 = this->_vptr_Cast_x86;
      p_Var12 = pp_Var10[-3];
      iVar9 = *(int *)(&this->field_0xd0 + (long)p_Var12);
      goto LAB_004d9f9b;
    }
LAB_004da109:
    pp_Var10 = pp_Var10 + -3;
  }
  else {
LAB_004d9f9b:
    if (iVar9 == 2) {
      iVar9 = 2;
      if ((*(int *)(&this->field_0xd4 + (long)p_Var12) != 1) ||
         (iVar3 = bottom_blob->c, (long)iVar3 < 1)) goto LAB_004da109;
      iVar9 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
      lVar20 = 0;
      do {
        if (0 < iVar9) {
          sVar16 = top_blob->cstep;
          sVar5 = bottom_blob->cstep;
          sVar6 = top_blob->elemsize;
          pvVar11 = top_blob->data;
          sVar7 = bottom_blob->elemsize;
          pvVar14 = bottom_blob->data;
          lVar19 = 0;
          do {
            fVar21 = float16_to_float32(*(unsigned_short *)
                                         ((long)pvVar14 + lVar19 * 2 + sVar5 * sVar7 * lVar20));
            *(float *)((long)pvVar11 + lVar19 * 4 + sVar16 * sVar6 * lVar20) = fVar21;
            lVar19 = lVar19 + 1;
          } while (iVar9 != (int)lVar19);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar3);
      pp_Var10 = this->_vptr_Cast_x86;
      p_Var12 = pp_Var10[-3];
      iVar9 = *(int *)(&this->field_0xd0 + (long)p_Var12);
    }
    pp_Var10 = pp_Var10 + -3;
    if (iVar9 == 3) {
      if ((int)_c < 1 || *(int *)(&this->field_0xd4 + (long)p_Var12) != 1) {
        return 0;
      }
      uVar18 = iVar2 * _elempack * iVar13 * iVar1;
      pvVar11 = bottom_blob->data;
      sVar16 = bottom_blob->cstep;
      pvVar14 = top_blob->data;
      sVar5 = top_blob->cstep;
      sVar6 = top_blob->elemsize;
      sVar7 = bottom_blob->elemsize;
      uVar15 = 0;
      do {
        if (0 < (int)uVar18) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar14 + uVar17 * 4) = (float)(int)*(char *)((long)pvVar11 + uVar17);
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
        }
        uVar15 = uVar15 + 1;
        pvVar14 = (void *)((long)pvVar14 + sVar5 * sVar6);
        pvVar11 = (void *)((long)pvVar11 + sVar16 * sVar7);
      } while (uVar15 != _c);
      p_Var12 = *pp_Var10;
      iVar9 = *(int *)(&this->field_0xd0 + (long)p_Var12);
    }
  }
  if (iVar9 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var12) != 4) {
      return 0;
    }
    iVar1 = bottom_blob->c;
    if ((long)iVar1 < 1) {
      return 0;
    }
    iVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    pvVar11 = bottom_blob->data;
    sVar16 = bottom_blob->elemsize;
    pvVar14 = top_blob->data;
    sVar5 = top_blob->elemsize;
    sVar6 = top_blob->cstep;
    sVar7 = bottom_blob->cstep;
    lVar20 = 0;
    do {
      if (0 < iVar13) {
        lVar19 = 0;
        do {
          *(undefined2 *)((long)pvVar14 + lVar19 * 2) =
               *(undefined2 *)((long)pvVar11 + lVar19 * 4 + 2);
          lVar19 = lVar19 + 1;
        } while (iVar13 != (int)lVar19);
      }
      lVar20 = lVar20 + 1;
      pvVar14 = (void *)((long)pvVar14 + sVar5 * sVar6);
      pvVar11 = (void *)((long)pvVar11 + sVar16 * sVar7);
    } while (lVar20 != iVar1);
    p_Var12 = *pp_Var10;
    iVar9 = *(int *)(&this->field_0xd0 + (long)p_Var12);
  }
  if (((iVar9 == 4) && (*(int *)(&this->field_0xd4 + (long)p_Var12) == 1)) &&
     (iVar1 = bottom_blob->c, 0 < (long)iVar1)) {
    iVar13 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    pvVar11 = bottom_blob->data;
    sVar16 = bottom_blob->elemsize;
    pvVar14 = top_blob->data;
    sVar5 = top_blob->elemsize;
    sVar6 = top_blob->cstep;
    sVar7 = bottom_blob->cstep;
    lVar20 = 0;
    do {
      if (0 < iVar13) {
        lVar19 = 0;
        do {
          *(uint *)((long)pvVar14 + lVar19 * 4) =
               (uint)*(ushort *)((long)pvVar11 + lVar19 * 2) << 0x10;
          lVar19 = lVar19 + 1;
        } while (iVar13 != (int)lVar19);
      }
      lVar20 = lVar20 + 1;
      pvVar14 = (void *)((long)pvVar14 + sVar5 * sVar6);
      pvVar11 = (void *)((long)pvVar11 + sVar16 * sVar7);
    } while (lVar20 != iVar1);
  }
  return 0;
}

Assistant:

int Cast_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 2 && type_to == 1)
    {
        cast_fp16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        cast_fp32_to_bf16_sse(bottom_blob, top_blob, opt);
    }

    if (type_from == 4 && type_to == 1)
    {
        cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
    }

    return 0;
}